

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

Aig_Man_t * Saig_ManPerformAbstraction(Saig_Tsim_t *pTsi,int nFrames,int fVerbose)

{
  undefined8 uVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  char *pcVar4;
  void *pvVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  void *__s;
  Aig_Man_t *p;
  char *pcVar8;
  Aig_Obj_t *pAVar9;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  int iVar12;
  Aig_Obj_t *p1;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  if (pTsi->vNonXRegs->nSize < 1) {
    __assert_fail("Vec_IntSize(pTsi->vNonXRegs) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x2f4,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
  }
  pAVar3 = pTsi->pAig;
  lVar22 = (long)pAVar3->vObjs->nSize * (long)nFrames;
  sVar15 = lVar22 * 8;
  __s = malloc(sVar15);
  pcVar8 = (char *)0x0;
  memset(__s,0,sVar15);
  p = Aig_ManStart((int)lVar22);
  pcVar4 = pAVar3->pName;
  if (pcVar4 != (char *)0x0) {
    sVar15 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar15 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p->pName = pcVar8;
  pcVar4 = pAVar3->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar15 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar15 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p->pSpec = pcVar8;
  auVar7 = _DAT_0094e250;
  if (0 < nFrames) {
    pAVar9 = p->pConst1;
    iVar12 = pAVar3->pConst1->Id * nFrames;
    lVar22 = (ulong)(uint)nFrames - 1;
    auVar26._8_4_ = (int)lVar22;
    auVar26._0_8_ = lVar22;
    auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
    lVar22 = 0;
    auVar26 = auVar26 ^ _DAT_0094e250;
    auVar27 = _DAT_0094e240;
    do {
      auVar28 = auVar27 ^ auVar7;
      if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                  auVar26._4_4_ < auVar28._4_4_) & 1)) {
        *(Aig_Obj_t **)((long)__s + lVar22 + (long)iVar12 * 8) = pAVar9;
      }
      if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
          auVar28._12_4_ <= auVar26._12_4_) {
        *(Aig_Obj_t **)((long)__s + lVar22 + (long)iVar12 * 8 + 8) = pAVar9;
      }
      lVar17 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar17 + 2;
      lVar22 = lVar22 + 0x10;
    } while ((ulong)(nFrames + 1U >> 1) << 4 != lVar22);
    if (0 < nFrames) {
      iVar12 = pAVar3->nRegs;
      iVar13 = pAVar3->nObjs[2];
      iVar21 = 0;
      do {
        if (iVar12 < iVar13) {
          lVar22 = 0;
          do {
            if (pAVar3->vCis->nSize <= lVar22) goto LAB_006f6770;
            pvVar5 = pAVar3->vCis->pArray[lVar22];
            pAVar9 = Aig_ObjCreateCi(p);
            *(Aig_Obj_t **)
             ((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + iVar21) * 8) = pAVar9;
            lVar22 = lVar22 + 1;
            iVar12 = pAVar3->nRegs;
            iVar13 = pAVar3->nObjs[2];
          } while (lVar22 < iVar13 - iVar12);
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 != nFrames);
      goto LAB_006f6364;
    }
  }
  iVar12 = pAVar3->nRegs;
  iVar13 = pAVar3->nObjs[2];
LAB_006f6364:
  uVar14 = iVar13 - iVar12;
  pVVar11 = pAVar3->vCis;
  if ((int)uVar14 < pVVar11->nSize) {
    uVar23 = (ulong)uVar14;
    do {
      if ((int)uVar14 < 0) goto LAB_006f6770;
      pvVar5 = pVVar11->pArray[uVar23];
      pAVar9 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)__s + (long)*(int *)((long)pvVar5 + 0x24) * (long)nFrames * 8) = pAVar9;
      uVar23 = uVar23 + 1;
      pVVar11 = pAVar3->vCis;
    } while ((int)uVar23 < pVVar11->nSize);
  }
  if (nFrames < 1) {
    iVar12 = pAVar3->nRegs;
  }
  else {
    uVar23 = 0;
    do {
      lVar22 = (long)pTsi->vNonXRegs->nSize;
      iVar13 = (int)uVar23;
      if (0 < lVar22) {
        piVar6 = pTsi->vNonXRegs->pArray;
        pVVar11 = pAVar3->vCis;
        iVar12 = pAVar3->nTruePis;
        lVar17 = 0;
        do {
          iVar21 = piVar6[lVar17];
          uVar14 = iVar12 + iVar21;
          if ((((int)uVar14 < 0) || (pVVar11->nSize <= (int)uVar14)) ||
             ((long)pTsi->vStates->nSize <= (long)uVar23)) goto LAB_006f6770;
          uVar2 = *(uint *)((long)pTsi->vStates->pArray[uVar23] + (long)(iVar21 >> 4) * 4);
          uVar19 = uVar2 >> (((byte)(iVar21 * 2) & 0x1e) + 1 & 0x1f) & 1;
          bVar25 = (uVar2 >> (iVar21 * 2 & 0x1fU) & 1) != 0;
          if (1 < ((uint)bVar25 + uVar19 * 2) - 1) {
            __assert_fail("Value == SAIG_XVS0 || Value == SAIG_XVS1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                          ,0x312,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
          }
          pAVar9 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
          if ((uint)bVar25 + uVar19 * 2 == 2) {
            pAVar9 = p->pConst1;
          }
          *(Aig_Obj_t **)
           ((long)__s +
           (long)(*(int *)((long)pVVar11->pArray[uVar14] + 0x24) * nFrames + iVar13) * 8) = pAVar9;
          lVar17 = lVar17 + 1;
        } while (lVar22 != lVar17);
      }
      pVVar11 = pAVar3->vObjs;
      if (0 < pVVar11->nSize) {
        lVar22 = 0;
        do {
          pvVar5 = pVVar11->pArray[lVar22];
          if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
            uVar10 = *(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar5 + 8) & 1) ^
                       *(ulong *)((long)__s + (long)(*(int *)(uVar10 + 0x24) * nFrames + iVar13) * 8
                                 ));
            }
            uVar10 = *(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar5 + 0x10) & 1) ^
                   *(ulong *)((long)__s + (long)(*(int *)(uVar10 + 0x24) * nFrames + iVar13) * 8));
            }
            pAVar9 = Aig_And(p,pAVar9,p1);
            *(Aig_Obj_t **)
             ((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + iVar13) * 8) = pAVar9;
            pVVar11 = pAVar3->vObjs;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < pVVar11->nSize);
      }
      iVar12 = pAVar3->nRegs;
      uVar10 = (ulong)iVar12;
      if (0 < (long)uVar10) {
        pVVar11 = pAVar3->vCos;
        uVar16 = (ulong)(uint)(pAVar3->nObjs[3] - iVar12);
        iVar21 = -iVar12;
        uVar18 = uVar10;
        do {
          if ((((int)uVar16 < 0) || (pVVar11->nSize <= (int)uVar16)) ||
             ((uVar14 = pAVar3->nObjs[2] + iVar21, (int)uVar14 < 0 ||
              (pAVar3->vCis->nSize <= (int)uVar14)))) goto LAB_006f6770;
          uVar20 = *(ulong *)((long)pVVar11->pArray[uVar16] + 8);
          uVar24 = uVar20 & 0xfffffffffffffffe;
          if (uVar24 == 0) {
            uVar20 = 0;
          }
          else {
            uVar20 = (ulong)((uint)uVar20 & 1) ^
                     *(ulong *)((long)__s + (long)(*(int *)(uVar24 + 0x24) * nFrames + iVar13) * 8);
          }
          if ((long)uVar23 < (long)(ulong)(nFrames - 1)) {
            *(ulong *)((long)__s +
                      (long)(*(int *)((long)pAVar3->vCis->pArray[uVar14] + 0x24) * nFrames +
                            iVar13 + 1) * 8) = uVar20;
          }
          uVar16 = uVar16 + 1;
          iVar21 = iVar21 + 1;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uint)nFrames);
    if (0 < nFrames) {
      iVar13 = pAVar3->nObjs[3];
      iVar21 = 0;
      do {
        if ((int)uVar10 < iVar13) {
          lVar22 = 0;
          do {
            if (pAVar3->vCos->nSize <= lVar22) goto LAB_006f6770;
            pvVar5 = pAVar3->vCos->pArray[lVar22];
            uVar23 = *(ulong *)((long)pvVar5 + 8);
            uVar10 = uVar23 & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = (Aig_Obj_t *)
                       ((ulong)((uint)uVar23 & 1) ^
                       *(ulong *)((long)__s + (long)(*(int *)(uVar10 + 0x24) * nFrames + iVar21) * 8
                                 ));
            }
            pAVar9 = Aig_ObjCreateCo(p,pAVar9);
            *(Aig_Obj_t **)
             ((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + iVar21) * 8) = pAVar9;
            lVar22 = lVar22 + 1;
            uVar10 = (ulong)(uint)pAVar3->nRegs;
            iVar13 = pAVar3->nObjs[3];
          } while (lVar22 < iVar13 - pAVar3->nRegs);
        }
        iVar12 = (int)uVar10;
        iVar21 = iVar21 + 1;
      } while (iVar21 != nFrames);
    }
  }
  p->nRegs = iVar12;
  uVar1 = *(undefined8 *)(p->nObjs + 2);
  p->nTruePis = (int)uVar1 - iVar12;
  p->nTruePos = (int)((ulong)uVar1 >> 0x20) - iVar12;
  uVar14 = pAVar3->nObjs[3] - pAVar3->nRegs;
  pVVar11 = pAVar3->vCos;
  if ((int)uVar14 < pVVar11->nSize) {
    uVar23 = (ulong)uVar14;
    do {
      if ((int)uVar14 < 0) {
LAB_006f6770:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pVVar11->pArray[uVar23];
      uVar10 = *(ulong *)((long)pvVar5 + 8);
      uVar18 = uVar10 & 0xfffffffffffffffe;
      if (uVar18 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = (Aig_Obj_t *)
                 ((ulong)((uint)uVar10 & 1) ^
                 *(ulong *)((long)__s + (long)(*(int *)(uVar18 + 0x24) * nFrames + nFrames + -1) * 8
                           ));
      }
      pAVar9 = Aig_ObjCreateCo(p,pAVar9);
      *(Aig_Obj_t **)
       ((long)__s + (long)(*(int *)((long)pvVar5 + 0x24) * nFrames + nFrames + -1) * 8) = pAVar9;
      uVar23 = uVar23 + 1;
      pVVar11 = pAVar3->vCos;
    } while ((int)uVar23 < pVVar11->nSize);
    Aig_ManSeqCleanup(p);
  }
  else {
    Aig_ManSeqCleanup(p);
    if (__s == (void *)0x0) {
      return p;
    }
  }
  free(__s);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManPerformAbstraction( Saig_Tsim_t * pTsi, int nFrames, int fVerbose )
{
    Aig_Man_t * pFrames, * pAig = pTsi->pAig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    unsigned * pState;
    int i, f, Reg, Value;

    assert( Vec_IntSize(pTsi->vNonXRegs) > 0 );

    // create mapping for the frames nodes
    pObjMap = ABC_ALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Saig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // create the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // replace abstracted registers by constants
        Vec_IntForEachEntry( pTsi->vNonXRegs, Reg, i )
        {
            pObj = Saig_ManLo( pAig, Reg );
            pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, f );
            Value = (Abc_InfoHasBit( pState, 2 * Reg + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * Reg );
            assert( Value == SAIG_XVS0 || Value == SAIG_XVS1 );
            pObjNew = (Value == SAIG_XVS1)? Aig_ManConst1(pFrames) : Aig_ManConst0(pFrames);
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i ) 
        {
            pObjNew = Aig_And( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Saig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Saig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Saig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    pFrames->nRegs = pAig->nRegs;
    pFrames->nTruePis = Aig_ManCiNum(pFrames) - Aig_ManRegNum(pFrames); 
    pFrames->nTruePos = Aig_ManCoNum(pFrames) - Aig_ManRegNum(pFrames); 
    Aig_ManForEachLiSeq( pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,nFrames-1) );
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, nFrames-1, pObjNew );
    }
//Aig_ManPrintStats( pFrames );
    Aig_ManSeqCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
//    Aig_ManCiCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
    ABC_FREE( pObjMap );
    return pFrames;
}